

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
TestReaderTestparseWithDetailError::runTestCase(TestReaderTestparseWithDetailError *this)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  size_type sVar4;
  reference this_00;
  reference expr;
  Reader *this_01;
  string *in_RDI;
  vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_> errors;
  bool ok;
  Value root;
  Reader reader;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  Value *in_stack_fffffffffffffe30;
  uint line;
  undefined6 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3e;
  undefined1 in_stack_fffffffffffffe3f;
  TestResult *this_02;
  Reader *in_stack_fffffffffffffe50;
  Reader *in_stack_fffffffffffffe60;
  string local_198 [39];
  allocator<char> local_171;
  string local_170 [35];
  byte local_14d;
  Reader *in_stack_fffffffffffffeb8;
  Reader *in_stack_ffffffffffffff88;
  
  Json::Reader::Reader(in_stack_fffffffffffffe60);
  Json::Value::Value(in_stack_fffffffffffffe30,(ValueType)((ulong)in_stack_fffffffffffffe28 >> 0x20)
                    );
  line = (uint)((ulong)in_stack_fffffffffffffe30 >> 0x20);
  this_02 = (TestResult *)&local_171;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"{ \"property\" : \"v\\alue\" }",(allocator *)this_02);
  bVar1 = Json::Reader::parse(in_stack_fffffffffffffe50,in_RDI,(Value *)this_02,
                              (bool)in_stack_fffffffffffffe3f);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  local_14d = bVar1 & 1;
  if (local_14d != 0) {
    JsonTest::TestResult::addFailure
              (this_02,(char *)CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffe3e,
                                                       in_stack_fffffffffffffe38)),line,
               in_stack_fffffffffffffe28);
  }
  Json::Reader::getFormattedErrorMessages_abi_cxx11_(in_stack_ffffffffffffff88);
  bVar2 = std::operator==(in_stack_fffffffffffffe20,
                          (char *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
  std::__cxx11::string::~string(local_198);
  if ((bVar2 & 1) == 0) {
    JsonTest::TestResult::addFailure
              (this_02,(char *)CONCAT17(bVar1,CONCAT16(bVar2,in_stack_fffffffffffffe38)),line,
               in_stack_fffffffffffffe28);
  }
  Json::Reader::getStructuredErrors(in_stack_fffffffffffffeb8);
  sVar4 = std::vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>
          ::size((vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>
                  *)&stack0xfffffffffffffe50);
  if (sVar4 != 1) {
    JsonTest::TestResult::addFailure
              (this_02,(char *)CONCAT17(bVar1,CONCAT16(bVar2,in_stack_fffffffffffffe38)),line,
               in_stack_fffffffffffffe28);
  }
  this_00 = std::
            vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>::
            at((vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>
                *)in_stack_fffffffffffffe20,
               CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
  if (this_00->offset_start != 0xf) {
    JsonTest::TestResult::addFailure
              (this_02,(char *)CONCAT17(bVar1,CONCAT16(bVar2,in_stack_fffffffffffffe38)),
               (uint)((ulong)this_00 >> 0x20),in_stack_fffffffffffffe28);
  }
  expr = std::vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>
         ::at((vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>
               *)in_stack_fffffffffffffe20,
              CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
  if (expr->offset_limit != 0x17) {
    JsonTest::TestResult::addFailure
              (this_02,(char *)CONCAT17(bVar1,CONCAT16(bVar2,in_stack_fffffffffffffe38)),
               (uint)((ulong)this_00 >> 0x20),(char *)expr);
  }
  this_01 = (Reader *)
            std::
            vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>::
            at((vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>
                *)in_stack_fffffffffffffe20,
               CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          this_01,(char *)CONCAT17(in_stack_fffffffffffffe1f,
                                                   in_stack_fffffffffffffe18));
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              (this_02,(char *)CONCAT17(bVar1,CONCAT16(bVar2,in_stack_fffffffffffffe38)),
               (uint)((ulong)this_00 >> 0x20),(char *)expr);
  }
  std::vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>::
  ~vector((vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_> *)
          this_00);
  Json::Value::~Value((Value *)in_stack_fffffffffffffe50);
  Json::Reader::~Reader(this_01);
  return;
}

Assistant:

JSONTEST_FIXTURE(ReaderTest, parseWithDetailError) {
  Json::Reader reader;
  Json::Value root;
  bool ok = reader.parse("{ \"property\" : \"v\\alue\" }", root);
  JSONTEST_ASSERT(!ok);
  JSONTEST_ASSERT(reader.getFormattedErrorMessages() ==
                  "* Line 1, Column 16\n  Bad escape sequence in string\nSee "
                  "Line 1, Column 20 for detail.\n");
  std::vector<Json::Reader::StructuredError> errors =
      reader.getStructuredErrors();
  JSONTEST_ASSERT(errors.size() == 1);
  JSONTEST_ASSERT(errors.at(0).offset_start == 15);
  JSONTEST_ASSERT(errors.at(0).offset_limit == 23);
  JSONTEST_ASSERT(errors.at(0).message == "Bad escape sequence in string");
}